

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::InstanceArrayIntersectorKMB<4>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  uint uVar16;
  AABBNodeMB4D *node1;
  ulong uVar17;
  int iVar18;
  long lVar19;
  NodeRef *pNVar20;
  size_t sVar21;
  size_t sVar22;
  Primitive_conflict4 *prim;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar23;
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar35;
  float fVar36;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar34;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar41;
  float fVar43;
  vint4 ai;
  float fVar42;
  float fVar44;
  float fVar45;
  float fVar46;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar40;
  float fVar47;
  float fVar49;
  float fVar50;
  vint4 ai_1;
  undefined1 auVar48 [16];
  float fVar51;
  float fVar52;
  float fVar54;
  float fVar55;
  vint4 ai_3;
  undefined1 auVar53 [16];
  float fVar56;
  float fVar57;
  float fVar59;
  float fVar60;
  vint4 bi;
  undefined1 auVar58 [16];
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  vint4 bi_3;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  vint4 bi_1;
  float fVar72;
  float fVar73;
  uint uVar74;
  uint uVar75;
  uint uVar76;
  uint uVar77;
  uint uVar78;
  uint uVar79;
  uint uVar80;
  uint uVar81;
  uint uVar82;
  vint4 ai_2;
  uint uVar83;
  uint uVar84;
  uint uVar85;
  float fVar86;
  uint uVar87;
  float fVar89;
  uint uVar90;
  float fVar91;
  uint uVar92;
  vint4 bi_2;
  undefined1 auVar88 [16];
  float fVar93;
  uint uVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar101;
  float fVar102;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar100;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  vbool<4> vVar108;
  Precalculations pre;
  undefined1 local_17a8 [16];
  vbool<4> valid0;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  int local_16f8;
  int iStack_16f4;
  int iStack_16f0;
  int iStack_16ec;
  uint local_16e8;
  uint uStack_16e4;
  uint uStack_16e0;
  uint uStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar17 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (uVar17 != 8) {
    auVar27 = *(undefined1 (*) [16])(ray + 0x80);
    auVar88._0_12_ = ZEXT812(0);
    auVar88._12_4_ = 0;
    uVar74 = -(uint)(0.0 <= auVar27._0_4_ && (valid_i->field_0).i[0] == -1);
    uVar77 = -(uint)(0.0 <= auVar27._4_4_ && (valid_i->field_0).i[1] == -1);
    uVar80 = -(uint)(0.0 <= auVar27._8_4_ && (valid_i->field_0).i[2] == -1);
    uVar83 = -(uint)(0.0 <= auVar27._12_4_ && (valid_i->field_0).i[3] == -1);
    auVar33._4_4_ = uVar77;
    auVar33._0_4_ = uVar74;
    auVar33._8_4_ = uVar80;
    auVar33._12_4_ = uVar83;
    iVar18 = movmskps((int)context,auVar33);
    if (iVar18 != 0) {
      auVar33 = *(undefined1 (*) [16])(ray + 0x40);
      fVar66 = (float)DAT_01f4bd50;
      fVar68 = DAT_01f4bd50._4_4_;
      fVar70 = DAT_01f4bd50._8_4_;
      fVar72 = DAT_01f4bd50._12_4_;
      auVar48._4_4_ = -(uint)(ABS(auVar33._4_4_) < fVar68);
      auVar48._0_4_ = -(uint)(ABS(auVar33._0_4_) < fVar66);
      auVar48._8_4_ = -(uint)(ABS(auVar33._8_4_) < fVar70);
      auVar48._12_4_ = -(uint)(ABS(auVar33._12_4_) < fVar72);
      auVar53 = blendvps(auVar33,_DAT_01f4bd50,auVar48);
      auVar33 = *(undefined1 (*) [16])(ray + 0x50);
      auVar58._4_4_ = -(uint)(ABS(auVar33._4_4_) < fVar68);
      auVar58._0_4_ = -(uint)(ABS(auVar33._0_4_) < fVar66);
      auVar58._8_4_ = -(uint)(ABS(auVar33._8_4_) < fVar70);
      auVar58._12_4_ = -(uint)(ABS(auVar33._12_4_) < fVar72);
      auVar48 = blendvps(auVar33,_DAT_01f4bd50,auVar58);
      auVar33 = *(undefined1 (*) [16])(ray + 0x60);
      iVar18 = -(uint)(ABS(auVar33._8_4_) < fVar70);
      iVar24 = -(uint)(ABS(auVar33._12_4_) < fVar72);
      auVar32._0_8_ =
           CONCAT44(-(uint)(ABS(auVar33._4_4_) < fVar68),-(uint)(ABS(auVar33._0_4_) < fVar66));
      auVar32._8_4_ = iVar18;
      auVar32._12_4_ = iVar24;
      auVar25._8_4_ = iVar18;
      auVar25._0_8_ = auVar32._0_8_;
      auVar25._12_4_ = iVar24;
      auVar58 = blendvps(auVar33,_DAT_01f4bd50,auVar25);
      auVar33 = rcpps(auVar32,auVar53);
      fVar104 = auVar33._0_4_;
      fVar105 = auVar33._4_4_;
      fVar106 = auVar33._8_4_;
      fVar107 = auVar33._12_4_;
      auVar33 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar88);
      auVar26._4_4_ = uVar77;
      auVar26._0_4_ = uVar74;
      auVar26._8_4_ = uVar80;
      auVar26._12_4_ = uVar83;
      aVar100.v = (__m128)blendvps(_DAT_01f45a30,auVar33,auVar26);
      auVar33 = maxps(auVar27,auVar88);
      auVar88 = blendvps(_DAT_01f45a40,auVar33,auVar26);
      auVar27 = rcpps(auVar26,auVar48);
      fVar38 = auVar27._0_4_;
      fVar41 = auVar27._4_4_;
      fVar43 = auVar27._8_4_;
      fVar45 = auVar27._12_4_;
      auVar27 = rcpps(auVar33,auVar58);
      fVar95 = auVar27._0_4_;
      fVar96 = auVar27._4_4_;
      fVar97 = auVar27._8_4_;
      fVar98 = auVar27._12_4_;
      fVar66 = *(float *)ray;
      fVar68 = *(float *)(ray + 4);
      fVar70 = *(float *)(ray + 8);
      fVar72 = *(float *)(ray + 0xc);
      fVar38 = (1.0 - auVar48._0_4_ * fVar38) * fVar38 + fVar38;
      fVar41 = (1.0 - auVar48._4_4_ * fVar41) * fVar41 + fVar41;
      fVar43 = (1.0 - auVar48._8_4_ * fVar43) * fVar43 + fVar43;
      fVar45 = (1.0 - auVar48._12_4_ * fVar45) * fVar45 + fVar45;
      uVar12 = *(undefined8 *)(ray + 0x10);
      uVar13 = *(undefined8 *)(ray + 0x18);
      fVar104 = (1.0 - auVar53._0_4_ * fVar104) * fVar104 + fVar104;
      fVar105 = (1.0 - auVar53._4_4_ * fVar105) * fVar105 + fVar105;
      fVar106 = (1.0 - auVar53._8_4_ * fVar106) * fVar106 + fVar106;
      fVar107 = (1.0 - auVar53._12_4_ * fVar107) * fVar107 + fVar107;
      uVar14 = *(undefined8 *)(ray + 0x20);
      uVar15 = *(undefined8 *)(ray + 0x28);
      fVar95 = (1.0 - auVar58._0_4_ * fVar95) * fVar95 + fVar95;
      fVar96 = (1.0 - auVar58._4_4_ * fVar96) * fVar96 + fVar96;
      fVar97 = (1.0 - auVar58._8_4_ * fVar97) * fVar97 + fVar97;
      fVar98 = (1.0 - auVar58._12_4_ * fVar98) * fVar98 + fVar98;
      local_17a8._0_8_ = CONCAT44(uVar77,uVar74) ^ 0xffffffffffffffff;
      local_17a8._8_4_ = uVar80 ^ 0xffffffff;
      local_17a8._12_4_ = uVar83 ^ 0xffffffff;
      pNVar20 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar23 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01f45a30;
      stack_node[1].ptr = uVar17;
      stack_near[1].field_0 = aVar100;
LAB_006dd0a1:
      sVar22 = pNVar20[-1].ptr;
      if (sVar22 != 0xfffffffffffffff8) {
        pNVar20 = pNVar20 + -1;
        aVar34 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar23[-1].v;
        paVar23 = paVar23 + -1;
        fVar86 = auVar88._0_4_;
        fVar89 = auVar88._4_4_;
        fVar91 = auVar88._8_4_;
        fVar93 = auVar88._12_4_;
        auVar27._4_4_ = -(uint)(aVar34.v[1] < fVar89);
        auVar27._0_4_ = -(uint)(aVar34.v[0] < fVar86);
        auVar27._8_4_ = -(uint)(aVar34.v[2] < fVar91);
        auVar27._12_4_ = -(uint)(aVar34._12_4_ < fVar93);
        uVar16 = movmskps((int)uVar17,auVar27);
        uVar17 = (ulong)uVar16;
        if (uVar16 != 0) {
          do {
            uVar16 = (uint)sVar22;
            fVar31 = aVar34.v[0];
            fVar35 = aVar34.v[1];
            fVar36 = aVar34.v[2];
            fVar37 = aVar34.v[3];
            if ((sVar22 & 8) != 0) {
              if (sVar22 == 0xfffffffffffffff8) goto LAB_006dd3e7;
              auVar53._4_4_ = -(uint)(fVar35 < fVar89);
              auVar53._0_4_ = -(uint)(fVar31 < fVar86);
              auVar53._8_4_ = -(uint)(fVar36 < fVar91);
              auVar53._12_4_ = -(uint)(fVar37 < fVar93);
              uVar75 = movmskps((int)uVar17,auVar53);
              uVar17 = (ulong)uVar75;
              if (uVar75 != 0) {
                valid0.field_0._0_8_ = local_17a8._0_8_ ^ 0xffffffffffffffff;
                valid0.field_0.i[2] = local_17a8._8_4_ ^ 0xffffffff;
                valid0.field_0.i[3] = local_17a8._12_4_ ^ 0xffffffff;
                lVar19 = (ulong)(uVar16 & 0xf) - 7;
                prim = (Primitive_conflict4 *)(sVar22 & 0xfffffffffffffff0);
                goto LAB_006dd357;
              }
              break;
            }
            uVar17 = sVar22 & 0xfffffffffffffff0;
            sVar22 = 8;
            aVar34 = _DAT_01f45a30;
            for (lVar19 = -0x10;
                (lVar19 != 0 && (sVar2 = *(size_t *)(uVar17 + 0x20 + lVar19 * 2), sVar2 != 8));
                lVar19 = lVar19 + 4) {
              fVar46 = *(float *)(uVar17 + 0x90 + lVar19);
              fVar47 = *(float *)(uVar17 + 0x30 + lVar19);
              fVar61 = *(float *)(uVar17 + 0x40 + lVar19);
              fVar51 = *(float *)(uVar17 + 0x50 + lVar19);
              fVar62 = *(float *)(uVar17 + 0x60 + lVar19);
              fVar8 = *(float *)(ray + 0x70);
              fVar9 = *(float *)(ray + 0x74);
              fVar10 = *(float *)(ray + 0x78);
              fVar11 = *(float *)(ray + 0x7c);
              fVar52 = *(float *)(uVar17 + 0xb0 + lVar19);
              fVar56 = *(float *)(uVar17 + 0xd0 + lVar19);
              fVar57 = *(float *)(uVar17 + 0x70 + lVar19);
              fVar63 = *(float *)(uVar17 + 0xa0 + lVar19);
              fVar64 = *(float *)(uVar17 + 0xc0 + lVar19);
              fVar65 = *(float *)(uVar17 + 0xe0 + lVar19);
              fVar1 = *(float *)(uVar17 + 0x80 + lVar19);
              fVar39 = ((fVar46 * fVar8 + fVar47) - fVar66) * fVar104;
              fVar42 = ((fVar46 * fVar9 + fVar47) - fVar68) * fVar105;
              fVar44 = ((fVar46 * fVar10 + fVar47) - fVar70) * fVar106;
              fVar46 = ((fVar46 * fVar11 + fVar47) - fVar72) * fVar107;
              local_1728 = (float)uVar12;
              fStack_1724 = (float)((ulong)uVar12 >> 0x20);
              fStack_1720 = (float)uVar13;
              fStack_171c = (float)((ulong)uVar13 >> 0x20);
              fVar47 = ((fVar52 * fVar8 + fVar51) - local_1728) * fVar38;
              fVar49 = ((fVar52 * fVar9 + fVar51) - fStack_1724) * fVar41;
              fVar50 = ((fVar52 * fVar10 + fVar51) - fStack_1720) * fVar43;
              fVar51 = ((fVar52 * fVar11 + fVar51) - fStack_171c) * fVar45;
              fVar99 = (float)uVar14;
              fVar101 = (float)((ulong)uVar14 >> 0x20);
              fVar102 = (float)uVar15;
              fVar103 = (float)((ulong)uVar15 >> 0x20);
              fVar52 = ((fVar56 * fVar8 + fVar57) - fVar99) * fVar95;
              fVar54 = ((fVar56 * fVar9 + fVar57) - fVar101) * fVar96;
              fVar55 = ((fVar56 * fVar10 + fVar57) - fVar102) * fVar97;
              fVar56 = ((fVar56 * fVar11 + fVar57) - fVar103) * fVar98;
              fVar57 = ((fVar63 * fVar8 + fVar61) - fVar66) * fVar104;
              fVar59 = ((fVar63 * fVar9 + fVar61) - fVar68) * fVar105;
              fVar60 = ((fVar63 * fVar10 + fVar61) - fVar70) * fVar106;
              fVar61 = ((fVar63 * fVar11 + fVar61) - fVar72) * fVar107;
              fVar67 = ((fVar64 * fVar8 + fVar62) - local_1728) * fVar38;
              fVar69 = ((fVar64 * fVar9 + fVar62) - fStack_1724) * fVar41;
              fVar71 = ((fVar64 * fVar10 + fVar62) - fStack_1720) * fVar43;
              fVar73 = ((fVar64 * fVar11 + fVar62) - fStack_171c) * fVar45;
              fVar62 = ((fVar65 * fVar8 + fVar1) - fVar99) * fVar95;
              fVar63 = ((fVar65 * fVar9 + fVar1) - fVar101) * fVar96;
              fVar64 = ((fVar65 * fVar10 + fVar1) - fVar102) * fVar97;
              fVar65 = ((fVar65 * fVar11 + fVar1) - fVar103) * fVar98;
              uVar75 = (uint)((int)fVar57 < (int)fVar39) * (int)fVar57 |
                       (uint)((int)fVar57 >= (int)fVar39) * (int)fVar39;
              uVar78 = (uint)((int)fVar59 < (int)fVar42) * (int)fVar59 |
                       (uint)((int)fVar59 >= (int)fVar42) * (int)fVar42;
              uVar81 = (uint)((int)fVar60 < (int)fVar44) * (int)fVar60 |
                       (uint)((int)fVar60 >= (int)fVar44) * (int)fVar44;
              uVar84 = (uint)((int)fVar61 < (int)fVar46) * (int)fVar61 |
                       (uint)((int)fVar61 >= (int)fVar46) * (int)fVar46;
              uVar87 = (uint)((int)fVar67 < (int)fVar47) * (int)fVar67 |
                       (uint)((int)fVar67 >= (int)fVar47) * (int)fVar47;
              uVar90 = (uint)((int)fVar69 < (int)fVar49) * (int)fVar69 |
                       (uint)((int)fVar69 >= (int)fVar49) * (int)fVar49;
              uVar92 = (uint)((int)fVar71 < (int)fVar50) * (int)fVar71 |
                       (uint)((int)fVar71 >= (int)fVar50) * (int)fVar50;
              uVar94 = (uint)((int)fVar73 < (int)fVar51) * (int)fVar73 |
                       (uint)((int)fVar73 >= (int)fVar51) * (int)fVar51;
              uVar87 = ((int)uVar87 < (int)uVar75) * uVar75 | ((int)uVar87 >= (int)uVar75) * uVar87;
              uVar90 = ((int)uVar90 < (int)uVar78) * uVar78 | ((int)uVar90 >= (int)uVar78) * uVar90;
              uVar92 = ((int)uVar92 < (int)uVar81) * uVar81 | ((int)uVar92 >= (int)uVar81) * uVar92;
              uVar94 = ((int)uVar94 < (int)uVar84) * uVar84 | ((int)uVar94 >= (int)uVar84) * uVar94;
              uVar75 = (uint)((int)fVar62 < (int)fVar52) * (int)fVar62 |
                       (uint)((int)fVar62 >= (int)fVar52) * (int)fVar52;
              uVar78 = (uint)((int)fVar63 < (int)fVar54) * (int)fVar63 |
                       (uint)((int)fVar63 >= (int)fVar54) * (int)fVar54;
              uVar81 = (uint)((int)fVar64 < (int)fVar55) * (int)fVar64 |
                       (uint)((int)fVar64 >= (int)fVar55) * (int)fVar55;
              uVar84 = (uint)((int)fVar65 < (int)fVar56) * (int)fVar65 |
                       (uint)((int)fVar65 >= (int)fVar56) * (int)fVar56;
              uVar76 = ((int)uVar75 < (int)uVar87) * uVar87 | ((int)uVar75 >= (int)uVar87) * uVar75;
              uVar79 = ((int)uVar78 < (int)uVar90) * uVar90 | ((int)uVar78 >= (int)uVar90) * uVar78;
              uVar82 = ((int)uVar81 < (int)uVar92) * uVar92 | ((int)uVar81 >= (int)uVar92) * uVar81;
              uVar85 = ((int)uVar84 < (int)uVar94) * uVar94 | ((int)uVar84 >= (int)uVar94) * uVar84;
              uVar75 = (uint)((int)fVar57 < (int)fVar39) * (int)fVar39 |
                       (uint)((int)fVar57 >= (int)fVar39) * (int)fVar57;
              uVar78 = (uint)((int)fVar59 < (int)fVar42) * (int)fVar42 |
                       (uint)((int)fVar59 >= (int)fVar42) * (int)fVar59;
              uVar81 = (uint)((int)fVar60 < (int)fVar44) * (int)fVar44 |
                       (uint)((int)fVar60 >= (int)fVar44) * (int)fVar60;
              uVar84 = (uint)((int)fVar61 < (int)fVar46) * (int)fVar46 |
                       (uint)((int)fVar61 >= (int)fVar46) * (int)fVar61;
              uVar87 = (uint)((int)fVar67 < (int)fVar47) * (int)fVar47 |
                       (uint)((int)fVar67 >= (int)fVar47) * (int)fVar67;
              uVar90 = (uint)((int)fVar69 < (int)fVar49) * (int)fVar49 |
                       (uint)((int)fVar69 >= (int)fVar49) * (int)fVar69;
              uVar92 = (uint)((int)fVar71 < (int)fVar50) * (int)fVar50 |
                       (uint)((int)fVar71 >= (int)fVar50) * (int)fVar71;
              uVar94 = (uint)((int)fVar73 < (int)fVar51) * (int)fVar51 |
                       (uint)((int)fVar73 >= (int)fVar51) * (int)fVar73;
              uVar87 = ((int)uVar75 < (int)uVar87) * uVar75 | ((int)uVar75 >= (int)uVar87) * uVar87;
              uVar90 = ((int)uVar78 < (int)uVar90) * uVar78 | ((int)uVar78 >= (int)uVar90) * uVar90;
              uVar92 = ((int)uVar81 < (int)uVar92) * uVar81 | ((int)uVar81 >= (int)uVar92) * uVar92;
              uVar94 = ((int)uVar84 < (int)uVar94) * uVar84 | ((int)uVar84 >= (int)uVar94) * uVar94;
              uVar75 = (uint)((int)fVar62 < (int)fVar52) * (int)fVar52 |
                       (uint)((int)fVar62 >= (int)fVar52) * (int)fVar62;
              uVar78 = (uint)((int)fVar63 < (int)fVar54) * (int)fVar54 |
                       (uint)((int)fVar63 >= (int)fVar54) * (int)fVar63;
              uVar81 = (uint)((int)fVar64 < (int)fVar55) * (int)fVar55 |
                       (uint)((int)fVar64 >= (int)fVar55) * (int)fVar64;
              uVar84 = (uint)((int)fVar65 < (int)fVar56) * (int)fVar56 |
                       (uint)((int)fVar65 >= (int)fVar56) * (int)fVar65;
              uVar75 = (uint)((int)fVar86 < (int)uVar75) * (int)fVar86 |
                       ((int)fVar86 >= (int)uVar75) * uVar75;
              uVar78 = (uint)((int)fVar89 < (int)uVar78) * (int)fVar89 |
                       ((int)fVar89 >= (int)uVar78) * uVar78;
              uVar81 = (uint)((int)fVar91 < (int)uVar81) * (int)fVar91 |
                       ((int)fVar91 >= (int)uVar81) * uVar81;
              uVar84 = (uint)((int)fVar93 < (int)uVar84) * (int)fVar93 |
                       ((int)fVar93 >= (int)uVar84) * uVar84;
              local_16f8 = aVar100.i[0];
              iStack_16f4 = aVar100.i[1];
              iStack_16f0 = aVar100.i[2];
              iStack_16ec = aVar100.i[3];
              bVar3 = (float)((uint)((int)uVar76 < local_16f8) * local_16f8 |
                             ((int)uVar76 >= local_16f8) * uVar76) <=
                      (float)(((int)uVar87 < (int)uVar75) * uVar87 |
                             ((int)uVar87 >= (int)uVar75) * uVar75);
              bVar4 = (float)((uint)((int)uVar79 < iStack_16f4) * iStack_16f4 |
                             ((int)uVar79 >= iStack_16f4) * uVar79) <=
                      (float)(((int)uVar90 < (int)uVar78) * uVar90 |
                             ((int)uVar90 >= (int)uVar78) * uVar78);
              bVar5 = (float)((uint)((int)uVar82 < iStack_16f0) * iStack_16f0 |
                             ((int)uVar82 >= iStack_16f0) * uVar82) <=
                      (float)(((int)uVar92 < (int)uVar81) * uVar92 |
                             ((int)uVar92 >= (int)uVar81) * uVar81);
              bVar6 = (float)((uint)((int)uVar85 < iStack_16ec) * iStack_16ec |
                             ((int)uVar85 >= iStack_16ec) * uVar85) <=
                      (float)(((int)uVar94 < (int)uVar84) * uVar94 |
                             ((int)uVar94 >= (int)uVar84) * uVar84);
              if ((uVar16 & 7) == 6) {
                fVar46 = *(float *)(uVar17 + 0xf0 + lVar19);
                fVar47 = *(float *)(uVar17 + 0x100 + lVar19);
                bVar3 = (fVar8 < fVar47 && fVar46 <= fVar8) && bVar3;
                bVar4 = (fVar9 < fVar47 && fVar46 <= fVar9) && bVar4;
                bVar5 = (fVar10 < fVar47 && fVar46 <= fVar10) && bVar5;
                bVar6 = (fVar11 < fVar47 && fVar46 <= fVar11) && bVar6;
              }
              auVar28._0_4_ = (-(uint)(fVar31 < fVar86) & -(uint)bVar3) << 0x1f;
              auVar28._4_4_ = (-(uint)(fVar35 < fVar89) & -(uint)bVar4) << 0x1f;
              auVar28._8_4_ = (-(uint)(fVar36 < fVar91) & -(uint)bVar5) << 0x1f;
              auVar28._12_4_ = (-(uint)(fVar37 < fVar93) & -(uint)bVar6) << 0x1f;
              uVar75 = movmskps((int)valid_i,auVar28);
              valid_i = (vint<4> *)(ulong)uVar75;
              sVar21 = sVar22;
              aVar40 = aVar34;
              if ((uVar75 != 0) &&
                 (auVar7._4_4_ = uVar79, auVar7._0_4_ = uVar76, auVar7._8_4_ = uVar82,
                 auVar7._12_4_ = uVar85, aVar40.v = (__m128)blendvps(_DAT_01f45a30,auVar7,auVar28),
                 sVar21 = sVar2, sVar22 != 8)) {
                pNVar20->ptr = sVar22;
                pNVar20 = pNVar20 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar23->v = aVar34;
                paVar23 = paVar23 + 1;
              }
              aVar34 = aVar40;
              sVar22 = sVar21;
            }
          } while (sVar22 != 8);
        }
        goto LAB_006dd0a1;
      }
LAB_006dd3e7:
      auVar30._0_4_ = uVar74 & local_17a8._0_4_;
      auVar30._4_4_ = uVar77 & local_17a8._4_4_;
      auVar30._8_4_ = uVar80 & local_17a8._8_4_;
      auVar30._12_4_ = uVar83 & local_17a8._12_4_;
      auVar27 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f45a40,auVar30);
      *(undefined1 (*) [16])(ray + 0x80) = auVar27;
    }
  }
  return;
  while( true ) {
    valid_i = (vint<4> *)&local_16e8;
    vVar108 = InstanceArrayIntersectorKMB<4>::occluded
                        ((InstanceArrayIntersectorKMB<4> *)valid_i,&valid0,&pre,ray,context,prim);
    valid0.field_0.i[0] = ~local_16e8 & valid0.field_0.i[0];
    valid0.field_0.i[1] = ~uStack_16e4 & valid0.field_0.i[1];
    valid0.field_0.i[2] = ~uStack_16e0 & valid0.field_0.i[2];
    valid0.field_0.i[3] = ~uStack_16dc & valid0.field_0.i[3];
    uVar16 = movmskps(vVar108.field_0._0_4_,(undefined1  [16])valid0.field_0);
    uVar17 = (ulong)uVar16;
    prim = prim + 1;
    if (uVar16 == 0) break;
LAB_006dd357:
    uVar16 = (uint)uVar17;
    lVar19 = lVar19 + -1;
    if (lVar19 == 0) break;
  }
  auVar29._0_8_ = valid0.field_0._0_8_ ^ 0xffffffffffffffff;
  auVar29._8_4_ = valid0.field_0._8_4_ ^ 0xffffffff;
  auVar29._12_4_ = valid0.field_0._12_4_ ^ 0xffffffff;
  local_17a8 = local_17a8 | auVar29;
  uVar16 = movmskps(uVar16,local_17a8);
  uVar17 = (ulong)uVar16;
  if (uVar16 == 0xf) goto LAB_006dd3e7;
  auVar88 = blendvps(auVar88,_DAT_01f45a40,local_17a8);
  goto LAB_006dd0a1;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }